

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy.c
# Opt level: O2

int entropy_gather_internal(mbedtls_entropy_context *ctx)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  size_t olen;
  uchar buf [128];
  
  iVar2 = ctx->source_count;
  if (iVar2 == 0) {
    iVar2 = -0x40;
  }
  else {
    piVar3 = &ctx->source[0].strong;
    bVar1 = false;
    for (lVar4 = 0; lVar4 < iVar2; lVar4 = lVar4 + 1) {
      if (*piVar3 == 1) {
        bVar1 = true;
      }
      olen = 0;
      iVar2 = (*((mbedtls_entropy_source_state *)(piVar3 + -8))->f_source)
                        (*(void **)(piVar3 + -6),buf,0x80,&olen);
      if (iVar2 != 0) goto LAB_0010c110;
      if (olen != 0) {
        iVar2 = entropy_update(ctx,(uchar)lVar4,buf,olen);
        if (iVar2 != 0) {
          return iVar2;
        }
        *(size_t *)(piVar3 + -4) = *(size_t *)(piVar3 + -4) + olen;
      }
      iVar2 = ctx->source_count;
      piVar3 = piVar3 + 10;
    }
    iVar2 = -0x3d;
    if (bVar1) {
      iVar2 = 0;
    }
LAB_0010c110:
    mbedtls_zeroize(buf,0x80);
  }
  return iVar2;
}

Assistant:

static int entropy_gather_internal( mbedtls_entropy_context *ctx )
{
    int ret, i, have_one_strong = 0;
    unsigned char buf[MBEDTLS_ENTROPY_MAX_GATHER];
    size_t olen;

    if( ctx->source_count == 0 )
        return( MBEDTLS_ERR_ENTROPY_NO_SOURCES_DEFINED );

    /*
     * Run through our entropy sources
     */
    for( i = 0; i < ctx->source_count; i++ )
    {
        if( ctx->source[i].strong == MBEDTLS_ENTROPY_SOURCE_STRONG )
            have_one_strong = 1;

        olen = 0;
        if( ( ret = ctx->source[i].f_source( ctx->source[i].p_source,
                        buf, MBEDTLS_ENTROPY_MAX_GATHER, &olen ) ) != 0 )
        {
            goto cleanup;
        }

        /*
         * Add if we actually gathered something
         */
        if( olen > 0 )
        {
            if( ( ret = entropy_update( ctx, (unsigned char) i,
                                        buf, olen ) ) != 0 )
                return( ret );
            ctx->source[i].size += olen;
        }
    }

    if( have_one_strong == 0 )
        ret = MBEDTLS_ERR_ENTROPY_NO_STRONG_SOURCE;

cleanup:
    mbedtls_zeroize( buf, sizeof( buf ) );

    return( ret );
}